

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classifier.hpp
# Opt level: O1

void __thiscall
sp::template_classifier::create_templates(template_classifier *this,string *g_loc,string *b_loc)

{
  container_t ret;
  container_t local_78;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_58;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_38;
  
  local_58.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  make_templates_(&local_78,this,g_loc);
  local_38.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (this->good_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_38.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (this->good_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_38.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (this->good_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->good_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_78.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->good_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->good_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_78.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_38);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_78);
  make_templates_(&local_78,this,b_loc);
  local_38.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (this->bad_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_38.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (this->bad_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_38.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (this->bad_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->bad_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_78.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->bad_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->bad_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_78.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_38);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_78);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_58);
  return;
}

Assistant:

inline void create_templates(const std::string& g_loc, const std::string& b_loc)
	{
		container_t ret;
		good_templates = make_templates_(g_loc);
		bad_templates  = make_templates_(b_loc);
	}